

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O2

void __thiscall RenX::Server::banCheck(Server *this)

{
  _List_node_base *p_Var1;
  
  if ((this->players).super__List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>._M_impl.
      _M_node._M_size != 0) {
    p_Var1 = (_List_node_base *)&this->players;
    while (p_Var1 = (((_List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)
                     &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var1 != (_List_node_base *)&this->players) {
      if (*(char *)(p_Var1 + 0x10 + 1) == '\0') {
        banCheck(this,(PlayerInfo *)(p_Var1 + 1));
      }
    }
  }
  return;
}

Assistant:

void RenX::Server::banCheck() {
	if (this->players.size() != 0) {
		for (auto node = this->players.begin(); node != this->players.end(); ++node) {
			if (node->isBot == false) {
				banCheck(*node);
			}
		}
	}
}